

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdGetModifiedTxByHandle(void *handle,void *tx_data_handle,char **tx_hex_string)

{
  AbstractTransaction *this;
  char *pcVar1;
  CfdException *pCVar2;
  bool is_bitcoin;
  string base_tx;
  bool local_71;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  cfd::Initialize();
  local_70._0_8_ = &local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"TransactionData","");
  cfd::capi::CheckBuffer(tx_data_handle,(string *)local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._0_8_ != &local_60) {
    operator_delete((void *)local_70._0_8_);
  }
  if (tx_hex_string != (char **)0x0) {
    local_70._8_8_ = 0;
    local_60._M_allocated_capacity = local_60._M_allocated_capacity & 0xffffffffffffff00;
    local_71 = false;
    local_70._0_8_ = &local_60;
    cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&local_71);
    this = *(AbstractTransaction **)((long)tx_data_handle + 0x18);
    if (this != (AbstractTransaction *)0x0) {
      if (local_71 == true) {
        cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_50,this);
        pcVar1 = cfd::capi::CreateString(&local_50);
      }
      else {
        cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_50,this);
        pcVar1 = cfd::capi::CreateString(&local_50);
      }
      *tx_hex_string = pcVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._0_8_ != &local_60) {
        operator_delete((void *)local_70._0_8_);
      }
      return 0;
    }
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Invalid handle state. tx is null","");
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,&local_50);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_70._0_8_ = "cfdcapi_transaction.cpp";
  local_70._8_4_ = 0xde5;
  local_60._M_allocated_capacity = 0x5f6b98;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"tx hex string is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_70._0_8_ = &local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Failed to parameter. tx hex string is null.","");
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_70);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetModifiedTxByHandle(
    void* handle, void* tx_data_handle, char** tx_hex_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);
    if (tx_hex_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx hex string is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx hex string is null.");
    }

    std::string base_tx;
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      *tx_hex_string = CreateString(tx->GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      *tx_hex_string = CreateString(tx->GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}